

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkSVtolerances(ARKodeMem ark_mem,realtype reltol,N_Vector abstol)

{
  int iVar1;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  N_Vector x;
  realtype abstolmin;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSVtolerances","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,"ARKode","arkSVtolerances","Attempt to call before ARKodeInit.");
    local_4 = -0x17;
  }
  else if (0.0 <= (double)in_XMM0_Qa) {
    if (in_RSI == (N_Vector)0x0) {
      arkProcessError(in_RDI,-0x16,"ARKode","arkSVtolerances","abstol = NULL illegal.");
      local_4 = -0x16;
    }
    else if (in_RSI->ops->nvmin == (_func_realtype_N_Vector *)0x0) {
      arkProcessError(in_RDI,-0x16,"ARKode","arkSVtolerances","Missing N_VMin routine from N_Vector"
                     );
      local_4 = -0x16;
    }
    else {
      x = (N_Vector)N_VMin(in_RSI);
      if (0.0 <= (double)x) {
        in_RDI->atolmin0 = (uint)((double)x == 0.0);
        if (in_RDI->VabstolMallocDone == 0) {
          iVar1 = arkAllocVec(in_XMM0_Qa,in_RSI,(N_Vector *)x);
          if (iVar1 == 0) {
            arkProcessError(in_RDI,-0x14,"ARKode","arkSVtolerances",
                            "Allocation of arkode_mem failed.");
            return -0x16;
          }
          in_RDI->VabstolMallocDone = 1;
        }
        N_VScale((realtype)in_RSI,x,(N_Vector)0x115d687);
        in_RDI->reltol = (realtype)in_XMM0_Qa;
        in_RDI->itol = 1;
        in_RDI->user_efun = 0;
        in_RDI->efun = arkEwtSetSV;
        in_RDI->e_data = in_RDI;
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,-0x16,"ARKode","arkSVtolerances",
                        "abstol has negative component(s) (illegal).");
        local_4 = -0x16;
      }
    }
  }
  else {
    arkProcessError(in_RDI,-0x16,"ARKode","arkSVtolerances","reltol < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int arkSVtolerances(ARKodeMem ark_mem, realtype reltol, N_Vector abstol)
{
  /* local variables */
  realtype abstolmin;

  /* Check inputs */
  if (ark_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSVtolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkSVtolerances", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }
  if (reltol < ZERO) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSVtolerances", MSG_ARK_BAD_RELTOL);
    return(ARK_ILL_INPUT);
  }
  if (abstol == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSVtolerances", MSG_ARK_NULL_ABSTOL);
    return(ARK_ILL_INPUT);
  }
  if (abstol->ops->nvmin == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkSVtolerances",
                    "Missing N_VMin routine from N_Vector");
    return(ARK_ILL_INPUT);
  }
  abstolmin = N_VMin(abstol);
  if (abstolmin < ZERO) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSVtolerances", MSG_ARK_BAD_ABSTOL);
    return(ARK_ILL_INPUT);
  }

  /* Set flag indicating whether min(abstol) == 0 */
  ark_mem->atolmin0 = (abstolmin == ZERO);

  /* Copy tolerances into memory */
  if ( !(ark_mem->VabstolMallocDone) ) {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->Vabstol))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                      "arkSVtolerances", MSG_ARK_ARKMEM_FAIL);
      return(ARK_ILL_INPUT);
    }
    ark_mem->VabstolMallocDone = SUNTRUE;
  }
  N_VScale(ONE, abstol, ark_mem->Vabstol);
  ark_mem->reltol = reltol;
  ark_mem->itol   = ARK_SV;

  /* enforce use of arkEwtSetSV */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->efun      = arkEwtSetSV;
  ark_mem->e_data    = ark_mem;

  return(ARK_SUCCESS);
}